

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O0

Size __thiscall CMU462::Vertex::degree(Vertex *this)

{
  bool bVar1;
  pointer pHVar2;
  FaceIter *this_00;
  pointer this_01;
  HalfedgeIter *pHVar3;
  _List_iterator<CMU462::Halfedge> local_20;
  HalfedgeIter h;
  Size d;
  Vertex *this_local;
  
  h._M_node = (_List_node_base *)0x0;
  local_20._M_node = (this->_halfedge)._M_node;
  do {
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_20);
    this_00 = Halfedge::face(pHVar2);
    this_01 = std::_List_iterator<CMU462::Face>::operator->(this_00);
    bVar1 = Face::isBoundary(this_01);
    if (!bVar1) {
      h._M_node = (_List_node_base *)((long)&(h._M_node)->_M_next + 1);
    }
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->(&local_20);
    pHVar3 = Halfedge::twin(pHVar2);
    pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->(pHVar3);
    pHVar3 = Halfedge::next(pHVar2);
    local_20._M_node = pHVar3->_M_node;
    bVar1 = std::operator!=(&local_20,&this->_halfedge);
  } while (bVar1);
  return (Size)h._M_node;
}

Assistant:

Size degree() const {
          Size d = 0;  // degree

          // iterate over halfedges incident on this vertex
          HalfedgeIter h = _halfedge;
          do {
            // don't count boundary loops
            if (!h->face()->isBoundary()) {
              d++;  // increment degree
            }

            // move to the next halfedge around the vertex
            h = h->twin()->next();
          } while (h != _halfedge);  // done iterating over halfedges

          return d;
        }